

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_mul_into(mp_int *r,mp_int *a,mp_int *b)

{
  mp_int *x;
  ulong uVar1;
  
  uVar1 = b->nw;
  if (b->nw < a->nw) {
    uVar1 = a->nw;
  }
  if (r->nw < uVar1) {
    uVar1 = r->nw;
  }
  x = mp_make_sized(uVar1 * 6);
  mp_mul_internal(r,a,b,*x);
  mp_free(x);
  return;
}

Assistant:

void mp_mul_into(mp_int *r, mp_int *a, mp_int *b)
{
    mp_int *scratch = mp_make_sized(mp_mul_scratchspace(r->nw, a->nw, b->nw));
    mp_mul_internal(r, a, b, *scratch);
    mp_free(scratch);
}